

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool google::protobuf::internal::MapFieldPrinterHelper::SortMap
               (Message *message,Reflection *reflection,FieldDescriptor *field,
               vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               *sorted_map_field)

{
  bool bVar1;
  bool bVar2;
  MapFieldBase *this;
  RepeatedPtrFieldBase *this_00;
  MessageFactory *pMVar3;
  undefined4 extraout_var;
  Message *pMVar4;
  FieldDescriptor *pFVar5;
  Descriptor *pDVar6;
  _Iter_comp_iter<google::protobuf::MapEntryMessageComparator> __comp;
  int i;
  int iVar7;
  MapIterator iter;
  Message *map_entry_message;
  MapKey local_68;
  
  this = Reflection::GetMapData(reflection,message,field);
  bVar1 = MapFieldBase::IsRepeatedFieldValid(this);
  if (bVar1) {
    this_00 = &Reflection::GetRepeatedPtrFieldInternal<google::protobuf::Message>
                         (reflection,message,field)->super_RepeatedPtrFieldBase;
    for (iVar7 = 0; iVar7 < this_00->current_size_; iVar7 = iVar7 + 1) {
      iter.iter_.node_ =
           (NodeBase *)
           RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                     (this_00,iVar7);
      std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
      ::emplace_back<google::protobuf::Message_const*>
                ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                  *)sorted_map_field,(Message **)&iter);
    }
  }
  else {
    pDVar6 = FieldDescriptor::message_type(field);
    pMVar3 = Reflection::GetMessageFactory(reflection);
    iVar7 = (*pMVar3->_vptr_MessageFactory[2])(pMVar3,pDVar6);
    Reflection::MapBegin(&iter,reflection,message,field);
    while( true ) {
      Reflection::MapEnd((MapIterator *)&map_entry_message,reflection,message,field);
      bVar2 = protobuf::operator!=(&iter,(MapIterator *)&map_entry_message);
      MapKey::~MapKey(&local_68);
      if (!bVar2) break;
      pMVar4 = Message::New((Message *)CONCAT44(extraout_var,iVar7));
      map_entry_message = pMVar4;
      pFVar5 = Descriptor::field(pDVar6,0);
      CopyKey(&iter.key_,pMVar4,pFVar5);
      pMVar4 = map_entry_message;
      pFVar5 = Descriptor::field(pDVar6,1);
      CopyValue(&iter.value_,pMVar4,pFVar5);
      std::
      vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ::push_back(sorted_map_field,(value_type *)&map_entry_message);
      MapIterator::operator++(&iter);
    }
    MapKey::~MapKey(&iter.key_);
  }
  pDVar6 = FieldDescriptor::message_type(field);
  __comp._M_comp.field_ = (MapEntryMessageComparator)Descriptor::field(pDVar6,0);
  std::
  __stable_sort<__gnu_cxx::__normal_iterator<google::protobuf::Message_const**,std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::MapEntryMessageComparator>>
            ((__normal_iterator<const_google::protobuf::Message_**,_std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>_>
              )(sorted_map_field->
               super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               )._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_google::protobuf::Message_**,_std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>_>
              )(sorted_map_field->
               super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               )._M_impl.super__Vector_impl_data._M_finish,__comp);
  return !bVar1;
}

Assistant:

bool MapFieldPrinterHelper::SortMap(
    const Message& message, const Reflection* reflection,
    const FieldDescriptor* field,
    std::vector<const Message*>* sorted_map_field) {
  bool need_release = false;
  const MapFieldBase& base = *reflection->GetMapData(message, field);

  if (base.IsRepeatedFieldValid()) {
    const RepeatedPtrField<Message>& map_field =
        reflection->GetRepeatedPtrFieldInternal<Message>(message, field);
    for (int i = 0; i < map_field.size(); ++i) {
      sorted_map_field->push_back(
          const_cast<RepeatedPtrField<Message>*>(&map_field)->Mutable(i));
    }
  } else {
    // TODO: For performance, instead of creating map entry message
    // for each element, just store map keys and sort them.
    const Descriptor* map_entry_desc = field->message_type();
    const Message* prototype =
        reflection->GetMessageFactory()->GetPrototype(map_entry_desc);
    for (MapIterator iter =
             reflection->MapBegin(const_cast<Message*>(&message), field);
         iter != reflection->MapEnd(const_cast<Message*>(&message), field);
         ++iter) {
      Message* map_entry_message = prototype->New();
      CopyKey(iter.GetKey(), map_entry_message, map_entry_desc->field(0));
      CopyValue(iter.GetValueRef(), map_entry_message,
                map_entry_desc->field(1));
      sorted_map_field->push_back(map_entry_message);
    }
    need_release = true;
  }

  MapEntryMessageComparator comparator(field->message_type());
  std::stable_sort(sorted_map_field->begin(), sorted_map_field->end(),
                   comparator);
  return need_release;
}